

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O2

void __thiscall
WriterTestHelper<unsigned_char,_4U,_32856U>::~WriterTestHelper
          (WriterTestHelper<unsigned_char,_4U,_32856U> *this)

{
  ktxHashList_Destruct(&this->kvHash);
  ktxHashList_Destruct(&this->kvHash_ktx2);
  std::_Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>::~_Vector_base
            (&(this->imageList).super__Vector_base<wthImageInfo,_std::allocator<wthImageInfo>_>);
  std::
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ::~vector(&this->images);
  std::__cxx11::string::~string((string *)&this->comparisonWriter_ktx2);
  std::__cxx11::string::~string((string *)&this->writer_ktx2);
  return;
}

Assistant:

~WriterTestHelper() {
        ktxHashList_Destruct(&kvHash);
        ktxHashList_Destruct(&kvHash_ktx2);
    }